

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dobjtype.cpp
# Opt level: O0

void __thiscall PInt::SetOps(PInt *this)

{
  undefined1 uVar1;
  PInt *this_local;
  
  this->field_0x6a = 0x38;
  this->field_0x6b = 0;
  if (*(int *)&this->field_0x24 == 4) {
    this->field_0x69 = 0x29;
    this->field_0x68 = 0x10;
  }
  else if (*(int *)&this->field_0x24 == 1) {
    this->field_0x69 = 0x25;
    uVar1 = 0xc;
    if ((this->Unsigned & 1U) != 0) {
      uVar1 = 0x12;
    }
    this->field_0x68 = uVar1;
  }
  else {
    if (*(int *)&this->field_0x24 != 2) {
      __assert_fail("0 && \"Unhandled integer size\"",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/dobjtype.cpp"
                    ,800,"void PInt::SetOps()");
    }
    this->field_0x69 = 0x27;
    uVar1 = 0xe;
    if ((this->Unsigned & 1U) != 0) {
      uVar1 = 0x14;
    }
    this->field_0x68 = uVar1;
  }
  return;
}

Assistant:

void PInt::SetOps()
{
	moveOp = OP_MOVE;
	RegType = REGT_INT;
	if (Size == 4)
	{
		storeOp = OP_SW;
		loadOp = OP_LW;
	}
	else if (Size == 1)
	{
		storeOp = OP_SB;
		loadOp = Unsigned ? OP_LBU : OP_LB;
	}
	else if (Size == 2)
	{
		storeOp = OP_SH;
		loadOp = Unsigned ? OP_LHU : OP_LH;
	}
	else
	{
		assert(0 && "Unhandled integer size");
		storeOp = OP_NOP;
	}
}